

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O0

wchar_t breakage_chance(object *obj,_Bool hit_target)

{
  _Bool _Var1;
  wchar_t local_20;
  wchar_t perc;
  _Bool hit_target_local;
  object *obj_local;
  
  local_20 = obj->kind->base->break_perc;
  if (obj->artifact == (artifact *)0x0) {
    _Var1 = flag_has_dbg(obj->flags,6,0x29,"obj->flags","OF_THROWING");
    if (((_Var1) && (_Var1 = flag_has_dbg(obj->flags,6,0x27,"obj->flags","OF_EXPLODE"), !_Var1)) &&
       (_Var1 = tval_is_ammo(obj), !_Var1)) {
      local_20 = L'\x01';
    }
    if (hit_target) {
      obj_local._4_4_ = local_20;
    }
    else {
      obj_local._4_4_ = (local_20 * local_20) / 100;
    }
  }
  else {
    obj_local._4_4_ = L'\0';
  }
  return obj_local._4_4_;
}

Assistant:

int breakage_chance(const struct object *obj, bool hit_target) {
	int perc = obj->kind->base->break_perc;

	if (obj->artifact) return 0;
	if (of_has(obj->flags, OF_THROWING) &&
		!of_has(obj->flags, OF_EXPLODE) &&
		!tval_is_ammo(obj)) {
		perc = 1;
	}
	if (!hit_target) return (perc * perc) / 100;
	return perc;
}